

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O1

void __thiscall Parser_TokenizeFile_Test::~Parser_TokenizeFile_Test(Parser_TokenizeFile_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, TokenizeFile) {
    std::string filename = inTestDir("test.tok");
    std::ofstream out(filename);
    out << R"(
WorldBegin # hello
Integrator "deep" "float density" [ 2 2.66612 -5e-51]
)";
    out.close();
    ASSERT_TRUE(out.good());

    auto err = [](const char *err, const FileLoc *) {
        EXPECT_TRUE(false) << "Unexpected error: " << err;
    };
    // Windows won't let us remove the file on disk if we hold on to a mapping
    // view. So enclose the tokenizer in a scope so that it releases any file
    // mapping view before the remove.
    {
        auto t = Tokenizer::CreateFromFile(filename, err);
        ASSERT_TRUE(t.get() != nullptr);
        checkTokens(t.get(), {"WorldBegin", "# hello", "Integrator", "\"deep\"",
                              "\"float density\"", "[", "2", "2.66612", "-5e-51", "]"});
    }

    EXPECT_EQ(0, remove(filename.c_str()));
}